

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GEN_Register.cpp
# Opt level: O3

void __thiscall GEN_Register::setReg_8(GEN_Register *this,string *flagName,uint8_t value)

{
  int iVar1;
  bitset<8UL> *pbVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)flagName);
  if (iVar1 == 0) {
    pbVar2 = &AL;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)flagName);
    if (iVar1 == 0) {
      pbVar2 = &AH;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)flagName);
      if (iVar1 == 0) {
        pbVar2 = &DL;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)flagName);
        if (iVar1 == 0) {
          pbVar2 = &DH;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)flagName);
          if (iVar1 == 0) {
            pbVar2 = &CL;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)flagName);
            if (iVar1 == 0) {
              pbVar2 = &CH;
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)flagName);
              if (iVar1 == 0) {
                pbVar2 = &BL;
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)flagName);
                if (iVar1 != 0) {
                  return;
                }
                pbVar2 = &BH;
              }
            }
          }
        }
      }
    }
  }
  (pbVar2->super__Base_bitset<1UL>)._M_w = (ulong)value;
  return;
}

Assistant:

void GEN_Register::setReg_8(std::string flagName, uint8_t value)
{
	if (flagName == "AL")
	{
		AL = std::bitset<8>(value);
	} else if (flagName == "AH")
	{
		AH = std::bitset<8>(value);
	}
    else if (flagName == "DL")
    {
        DL = std::bitset<8>(value);
    } else if (flagName == "DH")
    {
        DH = std::bitset<8>(value);
    }
    else if (flagName == "CL")
    {
        CL = std::bitset<8>(value);
    } else if (flagName == "CH")
    {
        CH = std::bitset<8>(value);
    }
    else if (flagName == "BL")
    {
        BL = std::bitset<8>(value);
    } else if (flagName == "BH")
    {
        BH = std::bitset<8>(value);
    }
}